

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall mathOps_meas_Test::TestBody(mathOps_meas_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double in_XMM0_Qa;
  double dVar3;
  double in_XMM1_Qa;
  AssertHelper local_138;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  measurement um6;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  measurement um5;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  measurement um4;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  measurement um3;
  Message local_70 [3];
  measurement local_58;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  measurement um2;
  undefined1 local_20 [8];
  measurement um1;
  mathOps_meas_Test *this_local;
  
  um1.units_ = (unit)this;
  units::unit::pow((unit *)&units::m,in_XMM0_Qa,in_XMM1_Qa);
  units::measurement::measurement((measurement *)local_20,5.69,&um2.units_);
  join_0x00000000_0x00001200_ = units::cbrt<units::measurement,void>((measurement *)local_20);
  local_58 = units::root((measurement *)local_20,3);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_48,"um2","root(um1, 3)",(measurement *)&gtest_ar.message_,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um3.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um3.units_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um3.units_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  join_0x00000000_0x00001200_ = units::floor<units::measurement,void>((measurement *)local_20);
  dVar3 = units::measurement::value((measurement *)&gtest_ar_1.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_98,"um3.value()","5.0",dVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um4.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um4.units_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um4.units_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  join_0x00000000_0x00001200_ = units::trunc<units::measurement,void>((measurement *)local_20);
  dVar3 = units::measurement::value((measurement *)&gtest_ar_2.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"um4.value()","5.0",dVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um5.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x34,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um5.units_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um5.units_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  join_0x00000000_0x00001200_ = units::ceil<units::measurement,void>((measurement *)local_20);
  dVar3 = units::measurement::value((measurement *)&gtest_ar_3.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f8,"um5.value()","6.0",dVar3,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um6.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um6.units_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um6.units_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  join_0x00000000_0x00001200_ = units::round<units::measurement,void>((measurement *)local_20);
  dVar3 = units::measurement::value((measurement *)&gtest_ar_4.message_);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_128,"um6.value()","6.0",dVar3,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  return;
}

Assistant:

TEST(mathOps, meas)
{
    measurement um1(5.69, m.pow(3));

    auto um2 = cbrt(um1);
    EXPECT_EQ(um2, root(um1, 3));

    auto um3 = floor(um1);
    EXPECT_DOUBLE_EQ(um3.value(), 5.0);

    auto um4 = trunc(um1);
    EXPECT_DOUBLE_EQ(um4.value(), 5.0);

    auto um5 = ceil(um1);
    EXPECT_DOUBLE_EQ(um5.value(), 6.0);

    auto um6 = round(um1);
    EXPECT_DOUBLE_EQ(um6.value(), 6.0);
}